

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slinsolx3.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  void *pvVar2;
  float *pfVar3;
  int_t *rowind;
  int_t *colptr;
  float *x;
  float *pfVar4;
  ulong uVar5;
  int i_1;
  ulong uVar6;
  int i;
  long lVar7;
  int iVar8;
  int n;
  int m;
  char equed [1];
  int_t nnz;
  int_t info;
  float rcond;
  float rpg;
  float *local_360;
  void *local_358;
  FILE *local_350;
  mem_usage_t mem_usage;
  int_t lwork;
  size_t local_338;
  float *local_330;
  float *local_328;
  float *local_320;
  int *local_318;
  int *local_310;
  int_t *xa;
  int_t *asub;
  float *a;
  float *local_2f0;
  float *local_2e8;
  float u;
  trans_t trans;
  yes_no_t equil;
  SuperMatrix A;
  SuperLUStat_t stat;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix X;
  SuperMatrix B;
  superlu_options_t options;
  GlobalLU_t Glu;
  SuperMatrix B1;
  SuperMatrix A1;
  
  local_350 = _stdin;
  lwork = 0;
  equil = YES;
  u = 1.0;
  trans = NOTRANS;
  set_default_options(&options);
  parse_command_line(argc,argv,&lwork,&u,&equil,&trans);
  options.Equil = equil;
  options.DiagPivotThresh = (double)u;
  local_360 = (float *)CONCAT44(local_360._4_4_,trans);
  options.Trans = trans;
  local_338 = (size_t)lwork;
  if ((long)local_338 < 1) {
    local_358 = (void *)0x0;
  }
  else {
    local_358 = superlu_malloc(local_338);
    if (local_358 == (void *)0x0) {
      local_358 = (void *)0x0;
      sprintf((char *)&Glu,"%s at line %d in file %s\n","DLINSOLX: cannot allocate work[]",0x6a,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
             );
      superlu_abort_and_exit((char *)&Glu);
    }
  }
  sreadhb(local_350,&m,&n,&nnz,&a,&asub,&xa);
  pfVar3 = floatMalloc((long)nnz);
  if (pfVar3 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for a1[].",0x70,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  rowind = intMalloc(nnz);
  if (rowind == (int_t *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for asub1[].",0x71,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  colptr = intMalloc(n + 1);
  if (colptr == (int_t *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for xa1[].",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  for (lVar7 = 0; lVar7 < nnz; lVar7 = lVar7 + 1) {
    pfVar3[lVar7] = a[lVar7];
    rowind[lVar7] = asub[lVar7];
  }
  for (lVar7 = 0; lVar7 <= n; lVar7 = lVar7 + 1) {
    colptr[lVar7] = xa[lVar7];
  }
  local_2f0 = pfVar3;
  sCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_S,SLU_GE);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)(uint)A.nrow,(ulong)(uint)A.ncol,(ulong)*A.Store)
  ;
  pfVar3 = floatMalloc((long)m);
  if (pfVar3 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0x7d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  x = floatMalloc((long)m);
  if (x == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for rhsb1[].",0x7e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  pfVar4 = floatMalloc((long)m);
  if (pfVar4 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  sCreate_Dense_Matrix(&B,m,1,pfVar3,m,SLU_DN,SLU_S,SLU_GE);
  sCreate_Dense_Matrix(&X,m,1,pfVar4,m,SLU_DN,SLU_S,SLU_GE);
  pfVar4 = floatMalloc((long)n);
  iVar8 = n;
  sGenXtrue(n,1,pfVar4,n);
  local_2e8 = pfVar4;
  sFillRHS((trans_t)local_360,1,pfVar4,iVar8,&A,&B);
  uVar6 = 0;
  uVar5 = (ulong)(uint)m;
  if (m < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    x[uVar6] = pfVar3[uVar6];
  }
  local_350 = (FILE *)int32Malloc(n);
  if (local_350 == (FILE *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x89,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_310 = int32Malloc(m);
  if (local_310 == (int *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x8a,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_318 = int32Malloc(n);
  if (local_318 == (int *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for etree[].",0x8b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_320 = (float *)superlu_malloc((long)A.nrow << 2);
  if (local_320 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0x8d,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_328 = (float *)superlu_malloc((long)A.ncol << 2);
  if (local_328 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0x8f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_360 = (float *)superlu_malloc(4);
  if (local_360 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr[].",0x91,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  pfVar3 = (float *)superlu_malloc(4);
  if (pfVar3 == (float *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr[].",0x93,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsolx3.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  StatInit(&stat);
  sgssvx(&options,&A,&local_350->_flags,local_310,local_318,equed,local_320,local_328,&L,&U,
         local_358,(int_t)local_338,&B,&X,&rpg,&rcond,local_360,pfVar3,&Glu,&mem_usage,&stat,&info);
  printf("First system: sgssvx() returns info %lld\n",(long)info);
  if ((ulong)(uint)info == 0) {
LAB_00101981:
    if (options.PivotGrowth != NO) {
      printf("Recip. pivot growth = %e\n",(double)rpg);
    }
    if (options.ConditionNumber != NO) {
      printf("Recip. condition number = %e\n",(double)rcond);
    }
    pvVar2 = L.Store;
    pvVar1 = U.Store;
    printf("No of nonzeros in factor L = %lld\n",(long)*L.Store);
    printf("No of nonzeros in factor U = %lld\n",(long)*pvVar1);
    printf("No of nonzeros in L+U = %lld\n",((long)*pvVar1 + (long)*pvVar2) - (long)n);
    printf("FILL ratio = %.1f\n",(double)((float)((*pvVar1 + *pvVar2) - n) / (float)nnz));
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage.for_lu / 1000000.0,
           (double)mem_usage.total_needed / 1000000.0);
    pfVar4 = local_360;
    if (options.IterRefine != NOREFINE) {
      puts("Iterative Refinement:");
      printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
      printf("%8d%8d%16e%16e\n",(double)*pfVar4,(double)*pfVar3,1,(ulong)(uint)stat.RefineSteps);
    }
    fflush(_stdout);
  }
  else {
    if (info == n + 1) goto LAB_00101981;
    if ((int)local_338 == -1 && 0 < info) {
      printf("** Estimated memory: %lld bytes\n",(ulong)(uint)info - (long)n);
    }
  }
  local_330 = pfVar3;
  if (options.PrintStat != NO) {
    StatPrint(&stat);
  }
  StatFree(&stat);
  Destroy_CompCol_Matrix(&A);
  Destroy_Dense_Matrix(&B);
  options.Fact = SamePattern_SameRowPerm;
  StatInit(&stat);
  sCreate_CompCol_Matrix(&A1,m,n,nnz,local_2f0,rowind,colptr,SLU_NC,SLU_S,SLU_GE);
  sCreate_Dense_Matrix(&B1,m,1,x,m,SLU_DN,SLU_S,SLU_GE);
  pfVar3 = local_360;
  iVar8 = (int)local_338;
  sgssvx(&options,&A1,&local_350->_flags,local_310,local_318,equed,local_320,local_328,&L,&U,
         local_358,iVar8,&B1,&X,&rpg,&rcond,local_360,local_330,&Glu,&mem_usage,&stat,&info);
  printf("\nSecond system: sgssvx() returns info %lld\n",(long)info);
  if ((ulong)(uint)info != 0) {
    if (info != n + 1) {
      if (iVar8 == -1 && 0 < info) {
        printf("** Estimated memory: %lld bytes\n",(ulong)(uint)info - (long)n);
      }
      goto LAB_00101d7b;
    }
  }
  if (options.PivotGrowth != NO) {
    printf("Recip. pivot growth = %e\n",(double)rpg);
  }
  if (options.ConditionNumber != NO) {
    printf("Recip. condition number = %e\n",(double)rcond);
  }
  printf("No of nonzeros in factor L = %lld\n",(long)*L.Store);
  printf("No of nonzeros in factor U = %lld\n",(long)*U.Store);
  printf("No of nonzeros in L+U = %lld\n",((long)*U.Store + (long)*L.Store) - (long)n);
  printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage.for_lu / 1000000.0,
         (double)mem_usage.total_needed / 1000000.0);
  pfVar3 = local_360;
  if (options.IterRefine != NOREFINE) {
    puts("Iterative Refinement:");
    printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
    printf("%8d%8d%16e%16e\n",(double)*pfVar3,(double)*local_330,1,(ulong)(uint)stat.RefineSteps);
  }
  fflush(_stdout);
LAB_00101d7b:
  if (options.PrintStat != NO) {
    StatPrint(&stat);
  }
  StatFree(&stat);
  superlu_free(local_2e8);
  superlu_free(local_318);
  superlu_free(local_310);
  superlu_free(local_350);
  superlu_free(local_320);
  superlu_free(local_328);
  superlu_free(pfVar3);
  superlu_free(local_330);
  Destroy_CompCol_Matrix(&A1);
  Destroy_Dense_Matrix(&B1);
  Destroy_Dense_Matrix(&X);
  if (iVar8 == 0) {
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);
  }
  else if (0 < iVar8) {
    superlu_free(local_358);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    char           equed[1];
    yes_no_t       equil;
    trans_t        trans;
    SuperMatrix    A, A1, L, U;
    SuperMatrix    B, B1, X;
    NCformat       *Astore;
    NCformat       *Ustore;
    SCformat       *Lstore;
    GlobalLU_t 	   Glu;
    float         *a, *a1;
    int_t          *asub, *xa, *asub1, *xa1;
    int            *perm_r; /* row permutations from partial pivoting */
    int            *perm_c; /* column permutation vector */
    int            *etree;
    void           *work = NULL;
    int            m, n, nrhs, ldx;
    int_t          info, lwork, nnz;
    float         *rhsb, *rhsb1, *rhsx, *xact;
    float         *R, *C;
    float         *ferr, *berr;
    float         u, rpg, rcond;
    mem_usage_t    mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE 	   *fp = stdin;

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    equil = YES;	
    u     = 1.0;
    trans = NOTRANS;

    /* Set the default input options:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
     */
    set_default_options(&options);

    /* Can use command line input to modify the defaults. */
    parse_command_line(argc, argv, &lwork, &u, &equil, &trans);
    options.Equil = equil;
    options.DiagPivotThresh = u;
    options.Trans = trans;

    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    ABORT("DLINSOLX: cannot allocate work[]");
	}
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    sreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    if ( !(a1 = floatMalloc(nnz)) ) ABORT("Malloc fails for a1[].");
    if ( !(asub1 = intMalloc(nnz)) ) ABORT("Malloc fails for asub1[].");
    if ( !(xa1 = intMalloc(n+1)) ) ABORT("Malloc fails for xa1[].");
    for (int i = 0; i < nnz; ++i) {
        a1[i] = a[i];
	asub1[i] = asub[i];
    }
    for (int i = 0; i < n+1; ++i) xa1[i] = xa[i];
    
    sCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_S, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    if ( !(rhsb = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsb1 = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb1[].");
    if ( !(rhsx = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    sCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_S, SLU_GE);
    sCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_S, SLU_GE);
    xact = floatMalloc(n * nrhs);
    ldx = n;
    sGenXtrue(n, nrhs, xact, ldx);
    sFillRHS(trans, nrhs, xact, ldx, &A, &B);
    for (int j = 0; j < nrhs; ++j)
        for (int i = 0; i < m; ++i) rhsb1[i+j*m] = rhsb[i+j*m];
    
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(R = (float *) SUPERLU_MALLOC(A.nrow * sizeof(float))) ) 
        ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (float *) SUPERLU_MALLOC(A.ncol * sizeof(float))) )
        ABORT("SUPERLU_MALLOC fails for C[].");
    if ( !(ferr = (float *) SUPERLU_MALLOC(nrhs * sizeof(float))) )
        ABORT("SUPERLU_MALLOC fails for ferr[].");
    if ( !(berr = (float *) SUPERLU_MALLOC(nrhs * sizeof(float))) ) 
        ABORT("SUPERLU_MALLOC fails for berr[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    /* ------------------------------------------------------------
       WE SOLVE THE LINEAR SYSTEM FOR THE FIRST TIME: AX = B
       ------------------------------------------------------------*/
    sgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("First system: sgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        float *sol = (float*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);

	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", (int)i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);

    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);
    Destroy_CompCol_Matrix(&A);
    Destroy_Dense_Matrix(&B);

    /* ------------------------------------------------------------
       NOW WE SOLVE ANOTHER LINEAR SYSTEM: A1*X = B1
       ONLY THE SPARSITY PATTERN OF A1 IS THE SAME AS THAT OF A.
       ------------------------------------------------------------*/
    options.Fact = SamePattern_SameRowPerm;
    StatInit(&stat); /* Initialize the statistics variables. */

    sCreate_CompCol_Matrix(&A1, m, n, nnz, a1, asub1, xa1,
                           SLU_NC, SLU_S, SLU_GE);
    sCreate_Dense_Matrix(&B1, m, nrhs, rhsb1, m, SLU_DN, SLU_S, SLU_GE);

    sgssvx(&options, &A1, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B1, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("\nSecond system: sgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        float *sol = (float*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", (int)i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);
    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    Destroy_CompCol_Matrix(&A1);
    Destroy_Dense_Matrix(&B1);
    Destroy_Dense_Matrix(&X);
    if ( lwork == 0 ) { /* Deallocate storage associated with L and U. */
        Destroy_SuperNode_Matrix(&L);
        Destroy_CompCol_Matrix(&U);
    } else if ( lwork > 0 ) {
        SUPERLU_FREE(work);
    }

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}